

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# as-02-info.cpp
# Opt level: O0

void __thiscall MyPictureDescriptor::MyDump(MyPictureDescriptor *this,FILE *stream)

{
  FILE *__stream;
  unsigned_short i_00;
  ui16_t uVar1;
  ui32_t uVar2;
  Raw *pRVar3;
  byte_t *pbVar4;
  ILogSink *this_00;
  uint local_64;
  uint local_60;
  uint i_2;
  int i_1;
  ui32_t precinct_set_size;
  byte local_50;
  byte local_4f;
  CodingStyleDefault_t coding_style_default;
  int i;
  ImageComponent_t image_components [3];
  ui32_t component_sizing;
  FILE *stream_local;
  MyPictureDescriptor *this_local;
  
  unique0x10000560 = (FILE *)stream;
  if (stream == (FILE *)0x0) {
    stack0xffffffffffffffe8 = _stderr;
  }
  if (this->m_CDCIDescriptor == (CDCIEssenceDescriptor *)0x0) {
    if (this->m_RGBADescriptor == (RGBAEssenceDescriptor *)0x0) {
      return;
    }
    (**(code **)(*(long *)this->m_RGBADescriptor + 0x88))
              (this->m_RGBADescriptor,stack0xffffffffffffffe8);
  }
  else {
    (**(code **)(*(long *)this->m_CDCIDescriptor + 0x88))
              (this->m_CDCIDescriptor,stack0xffffffffffffffe8);
  }
  if (this->m_JP2KSubDescriptor != (JPEG2000PictureSubDescriptor *)0x0) {
    (**(code **)(*(long *)this->m_JP2KSubDescriptor + 0x88))
              (this->m_JP2KSubDescriptor,stack0xffffffffffffffe8);
    fprintf(stack0xffffffffffffffe8,"    ImageComponents: (max=%d)\n",3);
    pRVar3 = ASDCP::MXF::optional_property<ASDCP::MXF::Raw>::const_get
                       ((optional_property<ASDCP::MXF::Raw> *)(this->m_JP2KSubDescriptor + 200));
    image_components._1_4_ = Kumu::ByteString::Length((ByteString *)pRVar3);
    if (image_components._1_4_ == 0x11) {
      pRVar3 = ASDCP::MXF::optional_property<ASDCP::MXF::Raw>::const_get
                         ((optional_property<ASDCP::MXF::Raw> *)(this->m_JP2KSubDescriptor + 200));
      pbVar4 = Kumu::ByteString::RoData((ByteString *)pRVar3);
      memcpy(coding_style_default.SPcod.PrecinctSize + 0x1f,pbVar4 + 8,
             (ulong)(image_components._1_4_ - 8));
    }
    else {
      this_00 = (ILogSink *)Kumu::DefaultLogSink();
      Kumu::ILogSink::Warn
                (this_00,"Unexpected PictureComponentSizing size: %u, should be 17.\n",
                 (ulong)(uint)image_components._1_4_);
    }
    fprintf(stack0xffffffffffffffe8,"  bits  h-sep v-sep\n");
    coding_style_default.SPcod.PrecinctSize[0x18] = '\0';
    coding_style_default.SPcod.PrecinctSize[0x19] = '\0';
    coding_style_default.SPcod.PrecinctSize[0x1a] = '\0';
    coding_style_default.SPcod.PrecinctSize[0x1b] = '\0';
    for (; (int)coding_style_default.SPcod.PrecinctSize._24_4_ <
           (int)(uint)*(ushort *)(this->m_JP2KSubDescriptor + 0xc4) &&
           (uint)coding_style_default.SPcod.PrecinctSize._24_4_ < 3;
        coding_style_default.SPcod.PrecinctSize._24_4_ =
             coding_style_default.SPcod.PrecinctSize._24_4_ + 1) {
      fprintf(stack0xffffffffffffffe8,"  %4d  %5d %5d\n",
              (ulong)(coding_style_default.SPcod.PrecinctSize
                      [(long)(int)coding_style_default.SPcod.PrecinctSize._24_4_ * 3 + 0x1f] + 1),
              (ulong)*(byte *)((long)&i +
                              (long)(int)coding_style_default.SPcod.PrecinctSize._24_4_ * 3),
              (ulong)*(byte *)((long)&i +
                              (long)(int)coding_style_default.SPcod.PrecinctSize._24_4_ * 3 + 1));
    }
    pRVar3 = ASDCP::MXF::optional_property<ASDCP::MXF::Raw>::const_get
                       ((optional_property<ASDCP::MXF::Raw> *)(this->m_JP2KSubDescriptor + 0xe8));
    pbVar4 = Kumu::ByteString::RoData((ByteString *)pRVar3);
    pRVar3 = ASDCP::MXF::optional_property<ASDCP::MXF::Raw>::const_get
                       ((optional_property<ASDCP::MXF::Raw> *)(this->m_JP2KSubDescriptor + 0xe8));
    uVar2 = Kumu::ByteString::Length((ByteString *)pRVar3);
    memcpy((void *)((long)&i_1 + 2),pbVar4,(ulong)uVar2);
    fprintf(stack0xffffffffffffffe8,"               Scod: %hhu\n",(ulong)i_1._2_1_);
    fprintf(stack0xffffffffffffffe8,"   ProgressionOrder: %hhu\n",(ulong)i_1._3_1_);
    __stream = stack0xffffffffffffffe8;
    i_00 = Kumu::cp2i<unsigned_short>((byte_t *)&precinct_set_size);
    uVar1 = Kumu::Swap2(i_00);
    fprintf(__stream,"     NumberOfLayers: %hd\n",(ulong)uVar1);
    fprintf(stack0xffffffffffffffe8," MultiCompTransform: %hhu\n",(ulong)precinct_set_size._2_1_);
    fprintf(stack0xffffffffffffffe8,"DecompositionLevels: %hhu\n",(ulong)precinct_set_size._3_1_);
    fprintf(stack0xffffffffffffffe8,"     CodeblockWidth: %hhu\n",(ulong)local_50);
    fprintf(stack0xffffffffffffffe8,"    CodeblockHeight: %hhu\n",(ulong)local_4f);
    fprintf(stack0xffffffffffffffe8,"     CodeblockStyle: %hhu\n",(ulong)coding_style_default.Scod);
    fprintf(stack0xffffffffffffffe8,"     Transformation: %hhu\n",
            (ulong)coding_style_default.SGcod.ProgressionOrder);
    i_2 = 0;
    for (local_60 = 0;
        coding_style_default.SGcod.NumberOfLayers[(int)local_60] != '\0' && local_60 < 0x20;
        local_60 = local_60 + 1) {
      i_2 = i_2 + 1;
    }
    fprintf(stack0xffffffffffffffe8,"          Precincts: %u\n",(ulong)i_2);
    fprintf(stack0xffffffffffffffe8,"precinct dimensions:\n");
    for (local_64 = 0; local_64 < i_2 && local_64 < 0x20; local_64 = local_64 + 1) {
      fprintf(stack0xffffffffffffffe8,"    %d: %d x %d\n",(ulong)(local_64 + 1),
              (ulong)(uint)s_exp_lookup
                           [(int)(coding_style_default.SGcod.NumberOfLayers[local_64] & 0xf)],
              (ulong)(uint)s_exp_lookup
                           [(int)(uint)coding_style_default.SGcod.NumberOfLayers[local_64] >> 4]);
    }
  }
  return;
}

Assistant:

void MyDump(FILE* stream) {
    if ( stream == 0 )
      {
	stream = stderr;
      }

    if ( m_CDCIDescriptor != 0 )
      {
	m_CDCIDescriptor->Dump(stream);
      }
    else if ( m_RGBADescriptor != 0 )
      {
	m_RGBADescriptor->Dump(stream);
      }
    else
      {
	return;
      }

    if ( m_JP2KSubDescriptor != 0 )
      {
	m_JP2KSubDescriptor->Dump(stream);

	fprintf(stream, "    ImageComponents: (max=%d)\n", JP2K::MaxComponents);

	//
	ui32_t component_sizing = m_JP2KSubDescriptor->PictureComponentSizing.const_get().Length();
	JP2K::ImageComponent_t image_components[JP2K::MaxComponents];

	if ( component_sizing == 17 ) // ( 2 * sizeof(ui32_t) ) + 3 components * 3 byte each
	  {
	    memcpy(&image_components,
		   m_JP2KSubDescriptor->PictureComponentSizing.const_get().RoData() + 8,
		   component_sizing - 8);
	  }
	else
	  {
	    DefaultLogSink().Warn("Unexpected PictureComponentSizing size: %u, should be 17.\n", component_sizing);
	  }

	fprintf(stream, "  bits  h-sep v-sep\n");

	for ( int i = 0; i < m_JP2KSubDescriptor->Csize && i < JP2K::MaxComponents; i++ )
	  {
	    fprintf(stream, "  %4d  %5d %5d\n",
		    image_components[i].Ssize + 1, // See ISO 15444-1, Table A11, for the origin of '+1'
		    image_components[i].XRsize,
		    image_components[i].YRsize
		    );
	  }

	//
	JP2K::CodingStyleDefault_t coding_style_default;

	memcpy(&coding_style_default,
	       m_JP2KSubDescriptor->CodingStyleDefault.const_get().RoData(),
	       m_JP2KSubDescriptor->CodingStyleDefault.const_get().Length());

	fprintf(stream, "               Scod: %hhu\n", coding_style_default.Scod);
	fprintf(stream, "   ProgressionOrder: %hhu\n", coding_style_default.SGcod.ProgressionOrder);
	fprintf(stream, "     NumberOfLayers: %hd\n",
		KM_i16_BE(Kumu::cp2i<ui16_t>(coding_style_default.SGcod.NumberOfLayers)));
    
	fprintf(stream, " MultiCompTransform: %hhu\n", coding_style_default.SGcod.MultiCompTransform);
	fprintf(stream, "DecompositionLevels: %hhu\n", coding_style_default.SPcod.DecompositionLevels);
	fprintf(stream, "     CodeblockWidth: %hhu\n", coding_style_default.SPcod.CodeblockWidth);
	fprintf(stream, "    CodeblockHeight: %hhu\n", coding_style_default.SPcod.CodeblockHeight);
	fprintf(stream, "     CodeblockStyle: %hhu\n", coding_style_default.SPcod.CodeblockStyle);
	fprintf(stream, "     Transformation: %hhu\n", coding_style_default.SPcod.Transformation);
    
	ui32_t precinct_set_size = 0;

	for ( int i = 0; coding_style_default.SPcod.PrecinctSize[i] != 0 && i < JP2K::MaxPrecincts; ++i )
	  {
	    ++precinct_set_size;
	  }

	fprintf(stream, "          Precincts: %u\n", precinct_set_size);
	fprintf(stream, "precinct dimensions:\n");

	for ( unsigned int i = 0; i < precinct_set_size && i < JP2K::MaxPrecincts; i++ )
	  fprintf(stream, "    %d: %d x %d\n", i + 1,
		  s_exp_lookup[coding_style_default.SPcod.PrecinctSize[i]&0x0f],
		  s_exp_lookup[(coding_style_default.SPcod.PrecinctSize[i]>>4)&0x0f]
		  );
      }
  }